

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChTexture.cpp
# Opt level: O1

void __thiscall chrono::ChTexture::ArchiveIN(ChTexture *this,ChArchiveIn *marchive)

{
  ChArchiveIn::VersionRead<chrono::ChTexture>(marchive);
  (**(code **)(*(long *)marchive + 0x40))(marchive);
  return;
}

Assistant:

void ChTexture::ArchiveIN(ChArchiveIn& marchive) {
    // version number
    /*int version =*/marchive.VersionRead<ChTexture>();
    // stream in all member data:
    marchive >> CHNVP(m_filename);
}